

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O0

FT_Error PCF_Face_Init(FT_Stream stream,FT_Face pcfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  FT_Generic_Finalizer p_Var1;
  bool bVar2;
  FT_Error FVar3;
  int iVar4;
  undefined1 local_78 [8];
  FT_CharMapRec charmap;
  char *s;
  FT_Bool unicode_charmap;
  FT_String *charset_encoding;
  FT_String *charset_registry;
  FT_Error error3;
  FT_Error error2;
  FT_Error error;
  PCF_Face face;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_index_local;
  FT_Face pcfface_local;
  FT_Stream stream_local;
  
  error3 = pcf_load_font(stream,(PCF_Face)pcfface,(long)face_index);
  if (error3 == 0) {
LAB_002f80e3:
    if (-1 < face_index) {
      if ((0 < face_index) && ((face_index & 0xffffU) != 0)) {
        PCF_Face_Done(pcfface);
        return 6;
      }
      p_Var1 = pcfface[1].generic.finalizer;
      bVar2 = false;
      if (((((p_Var1 != (FT_Generic_Finalizer)0x0) && (pcfface[1].generic.data != (void *)0x0)) &&
           ((charmap._8_8_ = p_Var1, *p_Var1 == (_func_void_void_ptr)0x69 ||
            (*p_Var1 == (_func_void_void_ptr)0x49)))) &&
          ((p_Var1[1] == (_func_void_void_ptr)0x73 || (p_Var1[1] == (_func_void_void_ptr)0x53)))) &&
         ((p_Var1[2] == (_func_void_void_ptr)0x6f || (p_Var1[2] == (_func_void_void_ptr)0x4f)))) {
        charmap._8_8_ = p_Var1 + 3;
        iVar4 = strcmp((char *)charmap._8_8_,"10646");
        if ((iVar4 == 0) ||
           ((iVar4 = strcmp((char *)charmap._8_8_,"8859"), iVar4 == 0 &&
            (iVar4 = strcmp((char *)pcfface[1].generic.data,"1"), iVar4 == 0)))) {
          bVar2 = true;
        }
        else {
          iVar4 = strcmp((char *)charmap._8_8_,"646.1991");
          if ((iVar4 == 0) && (iVar4 = strcmp((char *)pcfface[1].generic.data,"IRV"), iVar4 == 0)) {
            bVar2 = true;
          }
        }
      }
      charmap.face._0_4_ = 0;
      charmap.face._4_2_ = 0;
      if (bVar2) {
        charmap.face._0_4_ = 0x756e6963;
        charmap.face._4_2_ = 3;
      }
      charmap.face._7_1_ = 0;
      charmap.face._6_1_ = bVar2;
      local_78 = (undefined1  [8])pcfface;
      error3 = FT_CMap_New(&pcf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)local_78,
                           (FT_CMap_conflict *)0x0);
    }
  }
  else {
    PCF_Face_Done(pcfface);
    error3 = FT_Stream_OpenGzip((FT_Stream)(pcfface + 1),stream);
    if (((error3 & 0xffU) != 7) &&
       (((error3 == 0 ||
         (error3 = FT_Stream_OpenLZW((FT_Stream)(pcfface + 1),stream), (error3 & 0xffU) != 7)) &&
        (error3 == 0)))) {
      pcfface[1].charmaps = (FT_CharMap *)stream;
      pcfface->stream = (FT_Stream)(pcfface + 1);
      FVar3 = pcf_load_font(pcfface->stream,(PCF_Face)pcfface,(long)face_index);
      if (FVar3 == 0) {
        error3 = 0;
        goto LAB_002f80e3;
      }
    }
    PCF_Face_Done(pcfface);
    error3 = 2;
  }
  return error3;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Face_Init( FT_Stream      stream,
                 FT_Face        pcfface,        /* PCF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PCF_Face  face  = (PCF_Face)pcfface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PCF driver\n" ));

    error = pcf_load_font( stream, face, face_index );
    if ( error )
    {
      PCF_Face_Done( pcfface );

#if defined( FT_CONFIG_OPTION_USE_ZLIB )  || \
    defined( FT_CONFIG_OPTION_USE_LZW )   || \
    defined( FT_CONFIG_OPTION_USE_BZIP2 )

#ifdef FT_CONFIG_OPTION_USE_ZLIB
      {
        FT_Error  error2;


        /* this didn't work, try gzip support! */
        FT_TRACE2(( "  ... try gzip stream\n" ));
        error2 = FT_Stream_OpenGzip( &face->comp_stream, stream );
        if ( FT_ERR_EQ( error2, Unimplemented_Feature ) )
          goto Fail;

        error = error2;
      }
#endif /* FT_CONFIG_OPTION_USE_ZLIB */

#ifdef FT_CONFIG_OPTION_USE_LZW
      if ( error )
      {
        FT_Error  error3;


        /* this didn't work, try LZW support! */
        FT_TRACE2(( "  ... try LZW stream\n" ));
        error3 = FT_Stream_OpenLZW( &face->comp_stream, stream );
        if ( FT_ERR_EQ( error3, Unimplemented_Feature ) )
          goto Fail;

        error = error3;
      }
#endif /* FT_CONFIG_OPTION_USE_LZW */

#ifdef FT_CONFIG_OPTION_USE_BZIP2
      if ( error )
      {
        FT_Error  error4;


        /* this didn't work, try Bzip2 support! */
        FT_TRACE2(( "  ... try Bzip2 stream\n" ));
        error4 = FT_Stream_OpenBzip2( &face->comp_stream, stream );
        if ( FT_ERR_EQ( error4, Unimplemented_Feature ) )
          goto Fail;

        error = error4;
      }
#endif /* FT_CONFIG_OPTION_USE_BZIP2 */

      if ( error )
        goto Fail;

      face->comp_source = stream;
      pcfface->stream   = &face->comp_stream;

      stream = pcfface->stream;

      error = pcf_load_font( stream, face, face_index );
      if ( error )
        goto Fail;

#else /* !(FT_CONFIG_OPTION_USE_ZLIB ||
           FT_CONFIG_OPTION_USE_LZW ||
           FT_CONFIG_OPTION_USE_BZIP2) */

      goto Fail;

#endif
    }

    /* PCF cannot have multiple faces in a single font file.
     * XXX: A non-zero face_index is already an invalid argument, but
     *      Type1, Type42 drivers have a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index < 0 )
      goto Exit;
    else if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "PCF_Face_Init: invalid face index\n" ));
      PCF_Face_Done( pcfface );
      return FT_THROW( Invalid_Argument );
    }

    /* set up charmap */
    {
      FT_String  *charset_registry = face->charset_registry;
      FT_String  *charset_encoding = face->charset_encoding;
      FT_Bool     unicode_charmap  = 0;


      if ( charset_registry && charset_encoding )
      {
        char*  s = charset_registry;


        /* Uh, oh, compare first letters manually to avoid dependency
           on locales. */
        if ( ( s[0] == 'i' || s[0] == 'I' ) &&
             ( s[1] == 's' || s[1] == 'S' ) &&
             ( s[2] == 'o' || s[2] == 'O' ) )
        {
          s += 3;
          if ( !ft_strcmp( s, "10646" )                      ||
               ( !ft_strcmp( s, "8859" ) &&
                 !ft_strcmp( face->charset_encoding, "1" ) ) )
            unicode_charmap = 1;
          /* another name for ASCII */
          else if ( !ft_strcmp( s, "646.1991" )                 &&
                    !ft_strcmp( face->charset_encoding, "IRV" ) )
            unicode_charmap = 1;
        }
      }

      {
        FT_CharMapRec  charmap;


        charmap.face        = FT_FACE( face );
        charmap.encoding    = FT_ENCODING_NONE;
        /* initial platform/encoding should indicate unset status? */
        charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
        charmap.encoding_id = TT_APPLE_ID_DEFAULT;

        if ( unicode_charmap )
        {
          charmap.encoding    = FT_ENCODING_UNICODE;
          charmap.platform_id = TT_PLATFORM_MICROSOFT;
          charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        }

        error = FT_CMap_New( &pcf_cmap_class, NULL, &charmap, NULL );
      }
    }

  Exit:
    return error;

  Fail:
    FT_TRACE2(( "  not a PCF file\n" ));
    PCF_Face_Done( pcfface );
    error = FT_THROW( Unknown_File_Format );  /* error */
    goto Exit;
  }